

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::checkTransformFeedbackBuffer
          (CaptureVertexInterleaved *this,BindBufferCase bind_case,GLenum primitive_type)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 *puVar7;
  long lVar8;
  GLfloat result [4];
  GLfloat reference;
  GLfloat result_1;
  GLint i;
  GLuint j;
  bool is_ok;
  GLfloat *results;
  GLuint number_of_vertices;
  Functions *gl;
  GLenum primitive_type_local;
  BindBufferCase bind_case_local;
  CaptureVertexInterleaved *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext(this->m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  switch(primitive_type) {
  case 0:
    results._4_4_ = 5.60519e-45;
    break;
  case 1:
    results._4_4_ = 5.60519e-45;
    break;
  case 2:
    results._4_4_ = 1.12104e-44;
    break;
  case 3:
    results._4_4_ = 8.40779e-45;
    break;
  case 4:
    results._4_4_ = 8.40779e-45;
    break;
  case 5:
    results._4_4_ = 8.40779e-45;
    break;
  case 6:
    results._4_4_ = 8.40779e-45;
    break;
  default:
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  lVar8 = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xa89);
  bVar2 = true;
  result_1 = 0.0;
  do {
    bVar1 = false;
    if ((uint)result_1 < (uint)results._4_4_) {
      bVar1 = bVar2;
    }
    if (!bVar1) goto LAB_00e1b1f5;
    for (reference = 0.0; (int)reference < this->m_max_transform_feedback_components + -4;
        reference = (GLfloat)((int)reference + 1)) {
      if (0.125 < ABS(*(float *)(lVar8 + (ulong)(uint)((int)reference +
                                                      (int)result_1 *
                                                      this->m_max_transform_feedback_components) * 4
                                ) - (float)(int)reference)) {
        bVar2 = false;
        break;
      }
    }
    if ((((0.125 < ABS((ABS(*(float *)(lVar8 + (ulong)(((int)result_1 + 1) *
                                                       this->m_max_transform_feedback_components - 4
                                                      ) * 4)) - 1.0) + 0.0625)) ||
         (0.125 < ABS((ABS(*(float *)(lVar8 + (ulong)(((int)result_1 + 1) *
                                                      this->m_max_transform_feedback_components - 3)
                                              * 4)) - 1.0) + 0.0625))) ||
        (0.125 < ABS(*(float *)(lVar8 + (ulong)(((int)result_1 + 1) *
                                                this->m_max_transform_feedback_components - 2) * 4))
        )) || (0.125 < ABS(*(float *)(lVar8 + (ulong)(((int)result_1 + 1) *
                                                      this->m_max_transform_feedback_components - 1)
                                              * 4) - 1.0))) {
      bVar2 = false;
LAB_00e1b1f5:
      (**(code **)(lVar6 + 0x1670))(0x8c8e);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glUnmapBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xaad);
      return bVar2;
    }
    result_1 = (GLfloat)((int)result_1 + 1);
  } while( true );
}

Assistant:

bool gl3cts::TransformFeedback::CaptureVertexInterleaved::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					   glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check */
	glw::GLuint number_of_vertices = 0;

	switch (primitive_type)
	{
	case GL_POINTS:
		number_of_vertices = 4;
		break;
	case GL_LINES:
		number_of_vertices = 4;
		break;
	case GL_LINE_LOOP:
		number_of_vertices = 8;
		break;
	case GL_LINE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLES:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_FAN:
		number_of_vertices = 6;
		break;
	default:
		throw 0;
	}

	glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	bool is_ok = true;

	for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
	{
		for (glw::GLint i = 0; i < m_max_transform_feedback_components - 4; ++i)
		{
			glw::GLfloat result	= results[i + j * m_max_transform_feedback_components];
			glw::GLfloat reference = (glw::GLfloat)(i);

			if (fabs(result - reference) > 0.125 /* precision */)
			{
				is_ok = false;

				break;
			}
		}

		/* gl_Position */
		glw::GLfloat result[4] = { results[(j + 1) * m_max_transform_feedback_components - 4],
								   results[(j + 1) * m_max_transform_feedback_components - 3],
								   results[(j + 1) * m_max_transform_feedback_components - 2],
								   results[(j + 1) * m_max_transform_feedback_components - 1] };

		if ((fabs(fabs(result[0]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
			(fabs(fabs(result[1]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
			(fabs(result[2]) > 0.125 /* precision */) || (fabs(result[3] - 1.0) > 0.125 /* precision */))
		{
			is_ok = false;

			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	return is_ok;
}